

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O0

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  HighsStatus HVar1;
  string *in_RSI;
  bool partitioned;
  vector<int,_std::allocator<int>_> matrix_p_end;
  HighsInt in_stack_000000b8;
  HighsInt in_stack_000000bc;
  HighsLogOptions *in_stack_000000c8;
  vector<int,_std::allocator<int>_> *in_stack_000000e0;
  vector<int,_std::allocator<int>_> *in_stack_000000e8;
  vector<double,_std::allocator<double>_> *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff60;
  string local_78 [39];
  undefined1 local_51;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e344e);
  local_51 = 0;
  std::__cxx11::string::string(local_78,in_RSI);
  HVar1 = assessMatrix(in_stack_000000c8,(string *)matrix_value,in_stack_000000bc,in_stack_000000b8,
                       log_options._7_1_,(vector<int,_std::allocator<int>_> *)matrix_name,
                       in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,
                       (double)CONCAT44(vec_dim,num_vec),(double)matrix_start);
  std::__cxx11::string::~string(local_78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(HVar1,in_stack_ffffffffffffff60));
  return HVar1;
}

Assistant:

HighsStatus assessMatrix(const HighsLogOptions& log_options,
                         const std::string matrix_name, const HighsInt vec_dim,
                         const HighsInt num_vec, vector<HighsInt>& matrix_start,
                         vector<HighsInt>& matrix_index,
                         vector<double>& matrix_value,
                         const double small_matrix_value,
                         const double large_matrix_value) {
  vector<HighsInt> matrix_p_end;
  const bool partitioned = false;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      matrix_start, matrix_p_end, matrix_index, matrix_value,
                      small_matrix_value, large_matrix_value);
}